

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_statement.cpp
# Opt level: O0

void __thiscall cpp_db::sqlite_statement::execute(sqlite_statement *this)

{
  uint uVar1;
  int error;
  db_exception *this_00;
  element_type *peVar2;
  sqlite_exception *this_01;
  sqlite3 *db;
  int error_code;
  allocator<char> local_31;
  string local_30;
  sqlite_statement *local_10;
  sqlite_statement *this_local;
  
  local_10 = this;
  uVar1 = (*(this->super_statement_interface)._vptr_statement_interface[3])();
  if ((uVar1 & 1) == 0) {
    this_00 = (db_exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Statement not prepared!",&local_31);
    db_exception::db_exception(this_00,&local_30);
    __cxa_throw(this_00,&db_exception::typeinfo,db_exception::~db_exception);
  }
  peVar2 = std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->stmt).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>);
  error = sqlite3_step(peVar2);
  if (error != 0) {
    if ((error != 0x65) && (error != 100)) {
      this_01 = (sqlite_exception *)__cxa_allocate_exception(0x18);
      db = get_db_handle(this);
      sqlite_exception::sqlite_exception(this_01,error,db);
      __cxa_throw(this_01,&sqlite_exception::typeinfo,sqlite_exception::~sqlite_exception);
    }
    (*(this->super_statement_interface)._vptr_statement_interface[7])();
  }
  return;
}

Assistant:

void sqlite_statement::execute()
{
    if (!is_prepared())
        throw db_exception("Statement not prepared!");

    if (int error_code = sqlite3_step(stmt.get()))
    {
        if (error_code != SQLITE_DONE && error_code != SQLITE_ROW)
            throw sqlite_exception(error_code, get_db_handle());
        else
            reset();
    }
}